

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

void __thiscall gimage::View::View(View *this)

{
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image(&this->image,0,0,1);
  Image<float,_gimage::PixelTraits<float>_>::Image(&this->depth,0,0,1);
  this->camera = (Camera *)0x0;
  this->step = 1.0;
  return;
}

Assistant:

View::View()
{
  camera=0;
  step=1;
}